

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers.cc
# Opt level: O3

string * ctemplate::PrettyPrintModifiers
                   (string *__return_storage_ptr__,
                   vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
                   *modvals,string *separator)

{
  string *extraout_RDX;
  string *extraout_RDX_00;
  string *extraout_RDX_01;
  string *modval;
  pointer ppMVar1;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  ppMVar1 = (modvals->
            super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (ppMVar1 !=
      (modvals->
      super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    modval = separator;
    do {
      if (ppMVar1 !=
          (modvals->
          super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
          )._M_impl.super__Vector_impl_data._M_start) {
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)(separator->_M_dataplus)._M_p);
        modval = extraout_RDX;
      }
      PrettyPrintOneModifier_abi_cxx11_(&local_50,(ctemplate *)*ppMVar1,(ModifierAndValue *)modval);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
      modval = extraout_RDX_00;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
        modval = extraout_RDX_01;
      }
      ppMVar1 = ppMVar1 + 1;
    } while (ppMVar1 !=
             (modvals->
             super__Vector_base<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  }
  return __return_storage_ptr__;
}

Assistant:

string PrettyPrintModifiers(const vector<const ModifierAndValue*>& modvals,
                            const string& separator) {
  string out;
  for (vector<const ModifierAndValue*>::const_iterator it =
           modvals.begin(); it != modvals.end();  ++it) {
    if (it != modvals.begin())
      out.append(separator);
    out.append(PrettyPrintOneModifier(**it));
  }
  return out;
}